

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O1

u_char * ngx_http_log_json_variable(ngx_http_request_t *r,u_char *buf,ngx_http_log_op_t *op)

{
  uint uVar1;
  ngx_http_variable_value_t *pnVar2;
  
  pnVar2 = ngx_http_get_indexed_variable(r,op->data);
  if ((pnVar2 != (ngx_http_variable_value_t *)0x0) &&
     (uVar1 = *(uint *)pnVar2, (uVar1 >> 0x1e & 1) == 0)) {
    if ((int)uVar1 < 0) {
      buf = (u_char *)ngx_escape_json(buf,pnVar2->data,(ulong)(uVar1 & 0xfffffff));
    }
    else {
      memcpy(buf,pnVar2->data,(ulong)(uVar1 & 0xfffffff));
      buf = buf + (*(uint *)pnVar2 & 0xfffffff);
    }
  }
  return buf;
}

Assistant:

static u_char *
ngx_http_log_json_variable(ngx_http_request_t *r, u_char *buf,
    ngx_http_log_op_t *op)
{
    ngx_http_variable_value_t  *value;

    value = ngx_http_get_indexed_variable(r, op->data);

    if (value == NULL || value->not_found) {
        return buf;
    }

    if (value->escape == 0) {
        return ngx_cpymem(buf, value->data, value->len);

    } else {
        return (u_char *) ngx_escape_json(buf, value->data, value->len);
    }
}